

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O0

Vector3 * __thiscall
stateObservation::kine::Orientation::differentiate
          (Vector3 *__return_storage_ptr__,Orientation *this,Orientation *R_k1)

{
  Orientation local_188;
  Orientation local_d8;
  Orientation *local_20;
  Orientation *R_k1_local;
  Orientation *this_local;
  
  local_20 = R_k1;
  R_k1_local = this;
  this_local = (Orientation *)__return_storage_ptr__;
  check_(this);
  inverse(&local_188,this);
  Orientation(&local_d8,R_k1,&local_188);
  toRotationVector(__return_storage_ptr__,&local_d8);
  ~Orientation(&local_d8);
  ~Orientation(&local_188);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3 Orientation::differentiate(Orientation R_k1) const
{
  check_();
  return (Orientation(R_k1, inverse())).toRotationVector();
}